

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O2

void __thiscall InlineeFrameInfo::Dump(InlineeFrameInfo *this)

{
  InlineeFrameInfoValueType IVar1;
  int iVar2;
  ArgList *pAVar3;
  Type pIVar4;
  int i;
  long lVar5;
  long lVar6;
  
  Output::Print(L"func: ");
  IVar1 = (this->function).type;
  if (IVar1 == InlineeFrameInfoValueType_Sym) {
    Sym::Dump(&((this->function).field_1.sym)->super_Sym,(ValueType)0x9);
    Output::Print(L" ");
  }
  else if (IVar1 == InlineeFrameInfoValueType_Const) {
    Output::Print(L"%p(Var) ",(ulong)*(uint *)&(this->function).field_1,
                  (this->function).field_1.constValue.u);
  }
  Output::Print(L"args: ");
  pAVar3 = this->arguments;
  lVar6 = 0x10;
  for (lVar5 = 0;
      lVar5 < (pAVar3->
              super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
              count; lVar5 = lVar5 + 1) {
    pIVar4 = (pAVar3->
             super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
             buffer;
    iVar2 = *(int *)((long)pIVar4 + lVar6 + -0x10);
    if (iVar2 == 1) {
      Sym::Dump(*(Sym **)((long)pIVar4 + lVar6 + -8),(ValueType)0x9);
      Output::Print(L" ");
    }
    else if (iVar2 == 2) {
      Output::Print(L"%p(Var) ",(ulong)*(uint *)((long)pIVar4 + lVar6 + -8),
                    *(undefined8 *)((long)&pIVar4->type + lVar6));
    }
    Output::Print(L", ");
    lVar6 = lVar6 + 0x18;
  }
  return;
}

Assistant:

void InlineeFrameInfo::Dump() const
{
    Output::Print(_u("func: "));
    if (this->function.type == InlineeFrameInfoValueType_Const)
    {
        Output::Print(_u("%p(Var) "), this->function.constValue);
    }
    else if (this->function.type == InlineeFrameInfoValueType_Sym)
    {
        this->function.sym->Dump();
        Output::Print(_u(" "));
    }

    Output::Print(_u("args: "));
    arguments->Map([=](uint i, InlineFrameInfoValue& value)
    {
        if (value.type == InlineeFrameInfoValueType_Const)
        {
            Output::Print(_u("%p(Var) "), value.constValue);
        }
        else if (value.type == InlineeFrameInfoValueType_Sym)
        {
            value.sym->Dump();
            Output::Print(_u(" "));
        }
        Output::Print(_u(", "));
    });
}